

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntrusiveList.h
# Opt level: O1

void __thiscall
IntrusiveList<TypeHandle>::push_back(IntrusiveList<TypeHandle> *this,TypeHandle *node)

{
  TypeHandle *pTVar1;
  bool bVar2;
  
  if (node == (TypeHandle *)0x0) {
    __assert_fail("node",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/IntrusiveList.h"
                  ,0xf,"void IntrusiveList<TypeHandle>::push_back(T *) [T = TypeHandle]");
  }
  if (node->next == (TypeHandle *)0x0) {
    if (node->listed != true) {
      node->listed = true;
      bVar2 = this->head != (TypeHandle *)0x0;
      pTVar1 = (TypeHandle *)this;
      if (bVar2) {
        pTVar1 = this->tail;
      }
      pTVar1->next = node;
      (&this->head)[bVar2] = node;
      return;
    }
    __assert_fail("!node->listed",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/IntrusiveList.h"
                  ,0x11,"void IntrusiveList<TypeHandle>::push_back(T *) [T = TypeHandle]");
  }
  __assert_fail("node->next == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/IntrusiveList.h"
                ,0x10,"void IntrusiveList<TypeHandle>::push_back(T *) [T = TypeHandle]");
}

Assistant:

void push_back(T *node)
	{
		assert(node);
		assert(node->next == 0);
		assert(!node->listed);

		node->listed = true;

		if(!head)
		{
			head = tail = node;
		}
		else
		{
			tail->next = node;
			tail = node;
		}
	}